

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O3

void google::HandleCommandLineHelpFlags(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool *pbVar2;
  bool bVar3;
  int iVar4;
  char *prog_name;
  long *plVar5;
  size_t sVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined4 uVar9;
  ulong *puVar10;
  _Alloc_hider restrict;
  pointer pCVar11;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substrings;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong *local_a8;
  size_t local_a0;
  ulong local_98;
  long lStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> local_68;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  prog_name = ProgramInvocationShortName();
  HandleCommandLineCompletions();
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar10 = &local_98;
  local_a0 = 0;
  local_98 = local_98 & 0xffffffffffffff00;
  local_a8 = puVar10;
  std::__cxx11::string::push_back((char)&local_a8);
  std::__cxx11::string::append((char *)&local_a8);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,(long)local_a8 + local_a0);
  std::__cxx11::string::append((char *)&local_c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,(long)local_a8 + local_a0);
  std::__cxx11::string::append((char *)&local_c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,(long)local_a8 + local_a0);
  std::__cxx11::string::append((char *)&local_c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_a8 != puVar10) {
    operator_delete(local_a8);
  }
  if (fLB::FLAGS_helpshort == '\x01') {
    uVar9 = 1;
    ShowUsageWithFlagsMatching(prog_name,&local_88);
LAB_00197ea5:
    (*(code *)gflags_exitfunc)(uVar9);
    return;
  }
  if ((fLB::FLAGS_help != '\0') || (fLB::FLAGS_helpfull == '\x01')) {
    uVar9 = 1;
    ShowUsageWithFlagsRestrict(prog_name,"");
    goto LAB_00197ea5;
  }
  if (fLS::FLAGS_helpon_abi_cxx11_->_M_string_length != 0) {
    std::operator+(&local_c8,'/',fLS::FLAGS_helpon_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_98 = *puVar7;
      lStack_90 = plVar5[3];
    }
    else {
      local_98 = *puVar7;
      puVar10 = (ulong *)*plVar5;
    }
    local_a0 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_a8 = puVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    ShowUsageWithFlagsRestrict(prog_name,(char *)local_a8);
    (*(code *)gflags_exitfunc)(1);
    return;
  }
  if (fLS::FLAGS_helpmatch_abi_cxx11_[1] != 0) {
    uVar9 = 1;
    ShowUsageWithFlagsRestrict(prog_name,(char *)*fLS::FLAGS_helpmatch_abi_cxx11_);
    goto LAB_00197ea5;
  }
  if (fLB::FLAGS_helppackage != '\x01') {
    if (fLB::FLAGS_helpxml == '\x01') {
      uVar9 = 1;
      ShowXMLOfFlags(prog_name);
    }
    else {
      if (fLB::FLAGS_version != '\x01') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        return;
      }
      uVar9 = 0;
      ShowVersion();
    }
    goto LAB_00197ea5;
  }
  local_68.
  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAllFlags(&local_68);
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = local_98 & 0xffffffffffffff00;
  if (local_68.
      super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pCVar11 = local_68.
              super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar12 = &(local_68.
                super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                ._M_impl.super__Vector_impl_data._M_start)->filename;
    do {
      bVar3 = FileMatchesSubstring
                        ((google *)(psVar12->_M_dataplus)._M_p,
                         local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_88.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
      if (bVar3) {
        std::__cxx11::string::rfind((char)psVar12,0x2f);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar12);
        plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8.field_2._8_8_ = plVar5[3];
          local_c8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_c8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        restrict._M_p = local_c8._M_dataplus._M_p;
        if ((local_c8._M_string_length != local_a0) ||
           ((local_c8._M_string_length != 0 &&
            (iVar4 = bcmp(local_c8._M_dataplus._M_p,local_a8,local_c8._M_string_length), iVar4 != 0)
            ))) {
          ShowUsageWithFlagsRestrict(prog_name,restrict._M_p);
          if (local_a0 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Multiple packages contain a file=",0x21);
            if (prog_name == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1d4600);
            }
            else {
              sVar6 = strlen(prog_name);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,prog_name,sVar6);
            }
          }
          std::__cxx11::string::_M_assign((string *)&local_a8);
          restrict._M_p = local_c8._M_dataplus._M_p;
        }
        pCVar11 = local_68.
                  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)restrict._M_p != paVar1) {
          operator_delete(restrict._M_p);
          pCVar11 = local_68.
                    super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      pbVar2 = (bool *)(psVar12 + 1);
      psVar12 = (string *)((long)(psVar12 + 6) + 0x10);
    } while ((pointer)((long)pbVar2 + 0x10) != pCVar11);
    if (local_a0 != 0) goto LAB_001981b9;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unable to find a package for file=",0x22);
  std::operator<<((ostream *)&std::cerr,prog_name);
LAB_001981b9:
  (*(code *)gflags_exitfunc)(1);
  return;
}

Assistant:

void HandleCommandLineHelpFlags() {
  const char* progname = ProgramInvocationShortName();

  HandleCommandLineCompletions();

  vector<string> substrings;
  AppendPrognameStrings(&substrings, progname);

  if (FLAGS_helpshort) {
    // show only flags related to this binary:
    // E.g. for fileutil.cc, want flags containing   ... "/fileutil." cc
    ShowUsageWithFlagsMatching(progname, substrings);
    gflags_exitfunc(1);

  } else if (FLAGS_help || FLAGS_helpfull) {
    // show all options
    ShowUsageWithFlagsRestrict(progname, "");   // empty restrict
    gflags_exitfunc(1);

  } else if (!FLAGS_helpon.empty()) {
    string restrict = PATH_SEPARATOR + FLAGS_helpon + ".";
    ShowUsageWithFlagsRestrict(progname, restrict.c_str());
    gflags_exitfunc(1);

  } else if (!FLAGS_helpmatch.empty()) {
    ShowUsageWithFlagsRestrict(progname, FLAGS_helpmatch.c_str());
    gflags_exitfunc(1);

  } else if (FLAGS_helppackage) {
    // Shows help for all files in the same directory as main().  We
    // don't want to resort to looking at dirname(progname), because
    // the user can pick progname, and it may not relate to the file
    // where main() resides.  So instead, we search the flags for a
    // filename like "/progname.cc", and take the dirname of that.
    vector<CommandLineFlagInfo> flags;
    GetAllFlags(&flags);
    string last_package;
    for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
         flag != flags.end();
         ++flag) {
      if (!FileMatchesSubstring(flag->filename, substrings))
        continue;
      const string package = Dirname(flag->filename) + PATH_SEPARATOR;
      if (package != last_package) {
        ShowUsageWithFlagsRestrict(progname, package.c_str());
        VLOG(7) << "Found package: " << package;
        if (!last_package.empty()) {      // means this isn't our first pkg
          LOG(WARNING) << "Multiple packages contain a file=" << progname;
        }
        last_package = package;
      }
    }
    if (last_package.empty()) {   // never found a package to print
      LOG(WARNING) << "Unable to find a package for file=" << progname;
    }
    gflags_exitfunc(1);

  } else if (FLAGS_helpxml) {
    ShowXMLOfFlags(progname);
    gflags_exitfunc(1);

  } else if (FLAGS_version) {
    ShowVersion();
    // Unlike help, we may be asking for version in a script, so return 0
    gflags_exitfunc(0);

  }
}